

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::startpos<std::shared_ptr<chaiscript::AST_Node_const>>
          (string *__return_storage_ptr__,eval_error *this,shared_ptr<const_chaiscript::AST_Node> *t
          )

{
  ostream *poVar1;
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,*(int *)(*(long *)this + 0x40));
  poVar1 = std::operator<<(poVar1,", ");
  std::ostream::operator<<(poVar1,*(int *)(*(long *)this + 0x44));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string startpos(const T& t)
        {
          std::ostringstream oss;
          oss << t->start().line << ", " << t->start().column;
          return oss.str();
        }